

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  undefined8 this_00;
  bool bVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  LogMessage *pLVar4;
  string *value;
  SourceCodeInfo *other;
  allocator local_f9;
  string local_f8;
  LogFinisher local_d1;
  LogMessage local_d0;
  int local_94;
  undefined1 local_90 [8];
  LocationRecorder root_location;
  undefined1 local_68 [8];
  SourceCodeInfo source_code_info;
  FileDescriptorProto *file_local;
  Tokenizer *input_local;
  Parser *this_local;
  
  this->input_ = input;
  this->had_errors_ = false;
  source_code_info._40_8_ = file;
  std::__cxx11::string::clear();
  SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)local_68);
  this->source_code_info_ = (SourceCodeInfo *)local_68;
  bVar1 = LookingAtType(this,TYPE_START);
  if (bVar1) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder((LocationRecorder *)local_90,this);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)local_90,(Message *)source_code_info._40_8_,OTHER);
  if (((this->require_syntax_identifier_ & 1U) != 0) || (bVar1 = LookingAt(this,"syntax"), bVar1)) {
    bVar1 = ParseSyntaxIdentifier(this,(LocationRecorder *)local_90);
    this_00 = source_code_info._40_8_;
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_94 = 1;
      goto LAB_006310df;
    }
    if (source_code_info._40_8_ != 0) {
      puVar2 = internal::HasBits<1UL>::operator[]
                         ((HasBits<1UL> *)(source_code_info._40_8_ + 0x10),0);
      *(byte *)puVar2 = (byte)*puVar2 | 4;
      pAVar3 = MessageLite::GetArenaForAllocation((MessageLite *)this_00);
      internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)(this_00 + 0xc0),&this->syntax_identifier_,pAVar3);
    }
  }
  else if ((this->stop_after_syntax_identifier_ & 1U) == 0) {
    internal::LogMessage::LogMessage
              (&local_d0,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x289);
    pLVar4 = internal::LogMessage::operator<<(&local_d0,"No syntax specified for the proto file: ");
    value = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)source_code_info._40_8_);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,value);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,". Please use \'syntax = \"proto2\";\' ");
    pLVar4 = internal::LogMessage::operator<<
                       (pLVar4,"or \'syntax = \"proto3\";\' to specify a syntax ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,"version. (Defaulted to proto2 syntax.)");
    internal::LogFinisher::operator=(&local_d1,pLVar4);
    internal::LogMessage::~LogMessage(&local_d0);
    std::__cxx11::string::operator=((string *)&this->syntax_identifier_,"proto2");
  }
  if ((this->stop_after_syntax_identifier_ & 1U) == 0) {
    while (bVar1 = AtEnd(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = ParseTopLevelStatement
                        (this,(FileDescriptorProto *)source_code_info._40_8_,
                         (LocationRecorder *)local_90);
      if (!bVar1) {
        SkipStatement(this);
        bVar1 = LookingAt(this,"}");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_f8,"Unmatched \"}\".",&local_f9);
          AddError(this,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          io::Tokenizer::NextWithComments
                    (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
                     &this->upcoming_doc_comments_);
        }
      }
    }
    local_94 = 0;
  }
  else {
    this_local._7_1_ = (this->had_errors_ ^ 0xffU) & 1;
    local_94 = 1;
  }
LAB_006310df:
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_90);
  if (local_94 == 0) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    if (source_code_info._40_8_ == 0) {
      __assert_fail("file != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
                    ,0x2a4,
                    "bool google::protobuf::compiler::Parser::Parse(io::Tokenizer *, FileDescriptorProto *)"
                   );
    }
    other = FileDescriptorProto::mutable_source_code_info
                      ((FileDescriptorProto *)source_code_info._40_8_);
    SourceCodeInfo::Swap((SourceCodeInfo *)local_68,other);
    this_local._7_1_ = (this->had_errors_ ^ 0xffU) & 1;
    local_94 = 1;
  }
  SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)local_68);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier(root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != NULL) file->set_syntax(syntax_identifier_);
    } else if (!stop_after_syntax_identifier_) {
      GOOGLE_LOG(WARNING) << "No syntax specified for the proto file: " << file->name()
                   << ". Please use 'syntax = \"proto2\";' "
                   << "or 'syntax = \"proto3\";' to specify a syntax "
                   << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  assert(file != NULL);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}